

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O3

int get_rep_len_format_ID(void *format_ID)

{
  byte bVar1;
  ulong in_RAX;
  char *__format;
  
  if (format_ID == (void *)0x0) {
LAB_0011e9dc:
    in_RAX = in_RAX & 0xff;
    __format = "Unknown format version %d\n";
  }
  else {
    if ((((*(char *)((long)format_ID + 4) == '\0') && (*(char *)((long)format_ID + 5) == '\0')) &&
        (*(char *)((long)format_ID + 6) == '\0')) && (*(char *)((long)format_ID + 7) == '\0')) {
      in_RAX = (ulong)*format_ID;
    }
    else {
      bVar1 = *format_ID;
      in_RAX = (ulong)bVar1;
      if (1 < bVar1) {
        if (bVar1 == 2) {
          return (uint)*(byte *)((long)format_ID + 1) * 0x40000 +
                 (uint)(ushort)(*(ushort *)((long)format_ID + 2) << 8 |
                               *(ushort *)((long)format_ID + 2) >> 8) * 4;
        }
        goto LAB_0011e9dc;
      }
    }
    __format = "Format version %d has no size information \n";
  }
  printf(__format,in_RAX);
  return 0;
}

Assistant:

extern int
get_rep_len_format_ID(void *format_ID)
{
    switch (version_of_format_ID(format_ID)) {
    case 2:{
	    version_3_format_ID *id3 = (version_3_format_ID *) format_ID;
	    int rep_len = htons(id3->rep_len);
	    rep_len += (id3->top_byte_rep_len << 16);
	    return rep_len << 2;
	}
    case 0:
    case 1:
	printf("Format version %d has no size information \n",
	       *((unsigned char *) format_ID));
	break;
    default:
	printf("Unknown format version %d\n",
	       *((unsigned char *) format_ID));
	break;
    }
    return 0;
}